

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  ParseLocation PVar4;
  pointer pPVar5;
  ParseLocationRange *pPVar6;
  size_type __n;
  ParseLocationRange *pPVar7;
  slot_type *psVar8;
  reference extraout_RAX;
  reference ppVar9;
  reference extraout_RDX;
  slot_type *in_RSI;
  ParseLocationRange *pPVar10;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
    ::iterator::operator*((iterator *)this);
  }
  else if (pcVar1 != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
    goto LAB_0030e8f2;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
  ::iterator::operator*((iterator *)this);
LAB_0030e8f2:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
  ::iterator::operator*((iterator *)this);
  __n = std::
        vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
        ::_M_check_len((vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
                        *)this,1,"vector::_M_realloc_insert");
  psVar2 = (slot_type *)this->ctrl_;
  psVar3 = (this->field_1).slot_;
  if (__n == 0) {
    pPVar7 = (ParseLocationRange *)0x0;
  }
  else {
    pPVar7 = __gnu_cxx::new_allocator<google::protobuf::TextFormat::ParseLocationRange>::allocate
                       ((new_allocator<google::protobuf::TextFormat::ParseLocationRange> *)this,__n,
                        (void *)0x0);
  }
  PVar4 = (ParseLocation)
          (extraout_RDX->second).
          super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pPVar7[(long)in_RSI - (long)psVar2 >> 4].start = (ParseLocation)extraout_RDX->first;
  pPVar7[(long)in_RSI - (long)psVar2 >> 4].end = PVar4;
  psVar8 = psVar2;
  ppVar9 = extraout_RDX;
  pPVar10 = pPVar7;
  while (psVar8 != in_RSI) {
    pPVar5 = (psVar8->value).second.
             super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar10->start = (ParseLocation)(psVar8->value).first;
    *(pointer *)&(pPVar10->end).line = pPVar5;
    pPVar10 = pPVar10 + 1;
    psVar8 = (slot_type *)
             &(psVar8->value).second.
              super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppVar9 = (reference)psVar8;
  }
  for (; pPVar6 = pPVar10 + 1, psVar3 != in_RSI;
      in_RSI = (slot_type *)
               &(in_RSI->value).second.
                super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    PVar4 = (ParseLocation)
            (in_RSI->value).second.
            super__Vector_base<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pPVar6->start = (ParseLocation)(in_RSI->value).first;
    pPVar10[1].end = PVar4;
    pPVar10 = pPVar6;
  }
  if (psVar2 != (slot_type *)0x0) {
    operator_delete(psVar2,(long)this[1].ctrl_ - (long)psVar2);
    ppVar9 = extraout_RAX;
  }
  this->ctrl_ = (ctrl_t *)pPVar7;
  (this->field_1).slot_ = (slot_type *)pPVar6;
  this[1].ctrl_ = (ctrl_t *)(pPVar7 + __n);
  return ppVar9;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }